

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Addr pc,
          Dwarf_Half dwversion,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  source_location location;
  Dwarf_Half DVar1;
  undefined4 uVar2;
  undefined6 in_register_00000082;
  bool bVar3;
  die_object child;
  die_object current_obj_holder;
  undefined4 in_stack_ffffffffffffff18;
  die_object local_c8;
  die_object local_b8;
  anon_class_56_7_2a510682 local_a8;
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> local_70;
  anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>_2
  local_60;
  byte local_58;
  function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> local_50;
  
  uVar2 = (undefined4)CONCAT62(in_register_00000082,dwversion);
  DVar1 = die_object::get_tag(die);
  bVar3 = true;
  if (DVar1 != 0x2e) {
    DVar1 = die_object::get_tag(die);
    bVar3 = DVar1 == 0x1d;
  }
  location.file._4_4_ = uVar2;
  location.file._0_4_ = in_stack_ffffffffffffff18;
  location._8_8_ = cu_die;
  assert_impl<bool>((detail *)(ulong)bVar3,false,0x1e4df4,
                    "void cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info(const die_object &, const die_object &, Dwarf_Addr, Dwarf_Half, std::vector<stacktrace_frame> &)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                    ,location);
  die_object::die_object(&local_b8,this->dbg,(Dwarf_Die)0x0);
  local_58 = 1;
  local_60 = (anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>_2
              )die;
  do {
    if ((local_58 & 1) == 0) {
LAB_0019c59c:
      die_object::~die_object(&local_b8);
      return;
    }
    optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::unwrap
              ((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *)
               &local_60.uvalue);
    die_object::get_child(&local_c8);
    if (local_c8.die == (Dwarf_Die)0x0) {
      die_object::~die_object(&local_c8);
      goto LAB_0019c59c;
    }
    local_70.holds_value = false;
    local_a8.dwversion = (Dwarf_Half)uVar2;
    local_a8.current_obj_holder = &local_b8;
    local_a8.this = this;
    local_a8.cu_die = cu_die;
    local_a8.pc = pc;
    local_a8.inlines = inlines;
    local_a8.target_die = &local_70;
    std::function<bool(cpptrace::detail::libdwarf::die_object_const&)>::
    function<cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info(cpptrace::detail::libdwarf::die_object_const&,cpptrace::detail::libdwarf::die_object_const&,unsigned_long_long,unsigned_short,std::vector<cpptrace::stacktrace_frame,std::allocator<cpptrace::stacktrace_frame>>&)::_lambda(cpptrace::detail::libdwarf::die_object_const&)_1_,void>
              ((function<bool(cpptrace::detail::libdwarf::die_object_const&)> *)&local_50,&local_a8)
    ;
    walk_die_list(&local_c8,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0>::operator=
              ((optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> *)
               &local_60.uvalue,&local_70);
    die_object::~die_object(&local_c8);
  } while( true );
}

Assistant:

void get_inlines_info(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Addr pc,
            Dwarf_Half dwversion,
            std::vector<stacktrace_frame>& inlines
        ) {
            ASSERT(die.get_tag() == DW_TAG_subprogram || die.get_tag() == DW_TAG_inlined_subroutine);
            // get_inlines_info is recursive and recurses into dies with pc ranges matching the pc we're looking for,
            // however, because I wouldn't want anything stack overflowing I'm breaking the recursion out into a loop
            // while looping when we find the target die we need to be able to store a die somewhere that doesn't die
            // at the end of the list traversal, we'll use this as a holder for it
            die_object current_obj_holder(dbg, nullptr);
            optional<std::reference_wrapper<const die_object>> current_die = die;
            while(current_die.has_value()) {
                auto child = current_die.unwrap().get().get_child();
                if(!child) {
                    break;
                }
                optional<std::reference_wrapper<const die_object>> target_die;
                walk_die_list(
                    child,
                    [this, &cu_die, pc, dwversion, &inlines, &target_die, &current_obj_holder] (const die_object& die) {
                        if(die.get_tag() == DW_TAG_inlined_subroutine && die.pc_in_die(cu_die, dwversion, pc)) {
                            const auto name = subprogram_symbol(die, dwversion);
                            auto file_i = die.get_unsigned_attribute(DW_AT_call_file);
                            // TODO: Refactor.... Probably put logic in resolve_filename.
                            if(file_i) {
                                // for dwarf 2, 3, 4, and experimental line table version 0xfe06 1-indexing is used
                                // for dwarf 5 0-indexing is used
                                optional<std::reference_wrapper<line_table_info>> line_table_opt;
                                if(skeleton) {
                                    line_table_opt = skeleton.unwrap().resolver.get_line_table(
                                        skeleton.unwrap().cu_die
                                    );
                                } else {
                                    line_table_opt = get_line_table(cu_die);
                                }
                                if(line_table_opt) {
                                    auto& line_table = line_table_opt.unwrap().get();
                                    if(line_table.version != 5) {
                                        if(file_i.unwrap() == 0) {
                                            file_i.reset(); // 0 means no name to be found
                                        } else {
                                            // decrement to 0-based index
                                            file_i.unwrap()--;
                                        }
                                    }
                                } else {
                                    // silently continue
                                }
                            }
                            std::string file = file_i ? resolve_filename(cu_die, file_i.unwrap()) : "";
                            const auto line = die.get_unsigned_attribute(DW_AT_call_line);
                            const auto col = die.get_unsigned_attribute(DW_AT_call_column);
                            inlines.push_back(stacktrace_frame{
                                0,
                                0, // TODO: Could put an object address here...
                                {static_cast<std::uint32_t>(line.value_or(0))},
                                {static_cast<std::uint32_t>(col.value_or(0))},
                                file,
                                name,
                                true
                            });
                            current_obj_holder = die.clone();
                            target_die = current_obj_holder;
                            return false;
                        } else {
                            return true;
                        }
                    }
                );
                // recursing into the found target as-if by get_inlines_info(cu_die, die, pc, dwversion, inlines);
                current_die = target_die;
            }
        }